

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitGotoStatement(SyntaxDumper *this,GotoStatementSyntax *node)

{
  ExpressionSyntax *pEVar1;
  GotoStatementSyntax local_98 [72];
  GotoStatementSyntax local_50 [56];
  GotoStatementSyntax *local_18;
  GotoStatementSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (GotoStatementSyntax *)this;
  GotoStatementSyntax::gotoKeyword(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  pEVar1 = GotoStatementSyntax::expression(local_18);
  (**(code **)(*(long *)this + 0x2f0))(this,pEVar1);
  GotoStatementSyntax::semicolonToken(local_98);
  (**(code **)(*(long *)this + 0x2e8))(this,local_98,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_98);
  return Skip;
}

Assistant:

virtual Action visitGotoStatement(const GotoStatementSyntax* node) override
    {
        terminal(node->gotoKeyword(), node);
        nonterminal(node->expression());
        terminal(node->semicolonToken(), node);
        return Action::Skip;
    }